

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

uchar * sqlite3_serialize(sqlite3 *db,char *zSchema,sqlite3_int64 *piSize,uint mFlags)

{
  u32 uVar1;
  MemStore *pMVar2;
  Btree *pBVar3;
  Pager *pPVar4;
  sqlite3_stmt *pStmt_00;
  size_t __n;
  uint uVar5;
  int iVar6;
  int iVar7;
  MemFile *pMVar8;
  char *zSql;
  sqlite3_int64 sVar9;
  void *__dest;
  uchar *puVar10;
  ulong uVar11;
  u64 uVar12;
  uchar *__dest_00;
  DbPage *pPage;
  sqlite3_stmt *pStmt;
  DbPage *local_50;
  sqlite3_stmt *local_48;
  Btree *local_40;
  size_t local_38;
  
  local_48 = (sqlite3_stmt *)0x0;
  if (zSchema == (char *)0x0) {
    zSchema = db->aDb->zDbSName;
  }
  pMVar8 = memdbFromDbSchema(db,zSchema);
  uVar5 = sqlite3FindDbName(db,zSchema);
  if (piSize != (sqlite3_int64 *)0x0) {
    *piSize = -1;
  }
  if (-1 < (int)uVar5) {
    if (pMVar8 == (MemFile *)0x0) {
      pBVar3 = db->aDb[uVar5].pBt;
      if (pBVar3 != (Btree *)0x0) {
        uVar1 = pBVar3->pBt->pageSize;
        zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count",zSchema);
        if (zSql != (char *)0x0) {
          local_40 = pBVar3;
          local_38 = (long)(int)uVar1;
          iVar6 = sqlite3LockAndPrepare(db,zSql,-1,0x80,(Vdbe *)0x0,&local_48,(char **)0x0);
          sqlite3_free(zSql);
          pStmt_00 = local_48;
          if (iVar6 != 0) {
            return (uchar *)0x0;
          }
          iVar6 = sqlite3_step(local_48);
          if (iVar6 == 100) {
            sVar9 = sqlite3_column_int64(pStmt_00,0);
            __n = local_38;
            uVar12 = sVar9 * local_38;
            if (uVar12 == 0) {
              sqlite3_reset(pStmt_00);
              uVar12 = 0;
              sqlite3_exec(db,"BEGIN IMMEDIATE; COMMIT;",(sqlite3_callback)0x0,(void *)0x0,
                           (char **)0x0);
              iVar6 = sqlite3_step(pStmt_00);
              if (iVar6 == 100) {
                sVar9 = sqlite3_column_int64(pStmt_00,0);
                uVar12 = sVar9 * __n;
              }
            }
            if (piSize != (sqlite3_int64 *)0x0) {
              *piSize = uVar12;
            }
            if ((mFlags & 1) == 0) {
              iVar6 = sqlite3_initialize();
              if (iVar6 == 0) {
                puVar10 = (uchar *)sqlite3Malloc(uVar12);
              }
              else {
                puVar10 = (uchar *)0x0;
              }
              if (puVar10 != (uchar *)0x0) {
                iVar6 = sqlite3_column_int(pStmt_00,0);
                if (0 < iVar6) {
                  pPVar4 = local_40->pBt->pPager;
                  uVar11 = 1;
                  __dest_00 = puVar10;
                  do {
                    local_50 = (DbPage *)0x0;
                    iVar7 = (*pPVar4->xGet)(pPVar4,(Pgno)uVar11,&local_50,0);
                    if (iVar7 == 0) {
                      memcpy(__dest_00,local_50->pData,__n);
                    }
                    else {
                      memset(__dest_00,0,__n);
                    }
                    if (local_50 != (DbPage *)0x0) {
                      sqlite3PagerUnrefNotNull(local_50);
                    }
                    uVar11 = uVar11 + 1;
                    __dest_00 = __dest_00 + __n;
                  } while (iVar6 + 1 != uVar11);
                }
                goto LAB_00119cbb;
              }
            }
            puVar10 = (uchar *)0x0;
          }
          else {
            puVar10 = (uchar *)0x0;
          }
LAB_00119cbb:
          sqlite3_finalize(pStmt_00);
          return puVar10;
        }
        sqlite3_free((void *)0x0);
      }
    }
    else {
      pMVar2 = pMVar8->pStore;
      if (piSize != (sqlite3_int64 *)0x0) {
        *piSize = pMVar2->sz;
      }
      if ((mFlags & 1) != 0) {
        return pMVar2->aData;
      }
      uVar12 = pMVar2->sz;
      iVar6 = sqlite3_initialize();
      if (iVar6 == 0) {
        __dest = sqlite3Malloc(uVar12);
      }
      else {
        __dest = (void *)0x0;
      }
      if (__dest != (void *)0x0) {
        puVar10 = (uchar *)memcpy(__dest,pMVar2->aData,pMVar2->sz);
        return puVar10;
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

SQLITE_API unsigned char *sqlite3_serialize(
  sqlite3 *db,              /* The database connection */
  const char *zSchema,      /* Which database within the connection */
  sqlite3_int64 *piSize,    /* Write size here, if not NULL */
  unsigned int mFlags       /* Maybe SQLITE_SERIALIZE_NOCOPY */
){
  MemFile *p;
  int iDb;
  Btree *pBt;
  sqlite3_int64 sz;
  int szPage = 0;
  sqlite3_stmt *pStmt = 0;
  unsigned char *pOut;
  char *zSql;
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  if( zSchema==0 ) zSchema = db->aDb[0].zDbSName;
  p = memdbFromDbSchema(db, zSchema);
  iDb = sqlite3FindDbName(db, zSchema);
  if( piSize ) *piSize = -1;
  if( iDb<0 ) return 0;
  if( p ){
    MemStore *pStore = p->pStore;
    assert( pStore->pMutex==0 );
    if( piSize ) *piSize = pStore->sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = pStore->aData;
    }else{
      pOut = sqlite3_malloc64( pStore->sz );
      if( pOut ) memcpy(pOut, pStore->aData, pStore->sz);
    }
    return pOut;
  }
  pBt = db->aDb[iDb].pBt;
  if( pBt==0 ) return 0;
  szPage = sqlite3BtreeGetPageSize(pBt);
  zSql = sqlite3_mprintf("PRAGMA \"%w\".page_count", zSchema);
  rc = zSql ? sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0) : SQLITE_NOMEM;
  sqlite3_free(zSql);
  if( rc ) return 0;
  rc = sqlite3_step(pStmt);
  if( rc!=SQLITE_ROW ){
    pOut = 0;
  }else{
    sz = sqlite3_column_int64(pStmt, 0)*szPage;
    if( sz==0 ){
      sqlite3_reset(pStmt);
      sqlite3_exec(db, "BEGIN IMMEDIATE; COMMIT;", 0, 0, 0);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        sz = sqlite3_column_int64(pStmt, 0)*szPage;
      }
    }
    if( piSize ) *piSize = sz;
    if( mFlags & SQLITE_SERIALIZE_NOCOPY ){
      pOut = 0;
    }else{
      pOut = sqlite3_malloc64( sz );
      if( pOut ){
        int nPage = sqlite3_column_int(pStmt, 0);
        Pager *pPager = sqlite3BtreePager(pBt);
        int pgno;
        for(pgno=1; pgno<=nPage; pgno++){
          DbPage *pPage = 0;
          unsigned char *pTo = pOut + szPage*(sqlite3_int64)(pgno-1);
          rc = sqlite3PagerGet(pPager, pgno, (DbPage**)&pPage, 0);
          if( rc==SQLITE_OK ){
            memcpy(pTo, sqlite3PagerGetData(pPage), szPage);
          }else{
            memset(pTo, 0, szPage);
          }
          sqlite3PagerUnref(pPage);
        }
      }
    }
  }
  sqlite3_finalize(pStmt);
  return pOut;
}